

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
load_from_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  istream *piVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  double number;
  ifstream in;
  int aiStack_200 [122];
  
  std::ifstream::ifstream(&in);
  std::ifstream::open((char *)&in,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) {
    while( true ) {
      piVar1 = std::istream::_M_extract<double>((double *)&in);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<double,_std::allocator<double>_>::push_back
                (&this->sorted_vector_of_distances,&number);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"The file : ");
  poVar2 = std::operator<<(poVar2,filename);
  std::operator<<(poVar2," do not exist. The program will now terminate \n");
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "The persistence landscape file do not exist. The program will now terminate \n";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void Vector_distances_in_diagram<F>::load_from_file(const char* filename) {
  std::ifstream in;
  in.open(filename);
  // check if the file exist.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  double number;
  while (in >> number) {
    this->sorted_vector_of_distances.push_back(number);
  }
  in.close();
}